

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O0

pair<unsigned_long,_double> __thiscall
duckdb_skiplistlib::skip_list::
Node<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>::_Pool
::Release(_Pool *this,
         Node<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>
         *pNode)

{
  pair<unsigned_long,_double> pVar1;
  pair<unsigned_long,_double> *ppVar2;
  Node<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>
  *in_RSI;
  long in_RDI;
  pair<unsigned_long,_double> result;
  Node<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>
  *local_20 [2];
  unsigned_long local_10;
  double local_8;
  
  local_20[0] = in_RSI;
  ppVar2 = Node<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>
           ::value(in_RSI);
  local_10 = ppVar2->first;
  local_8 = ppVar2->second;
  std::
  swap<duckdb_skiplistlib::skip_list::Node<std::pair<unsigned_long,double>,duckdb::SkipLess<std::pair<unsigned_long,double>>>*>
            (local_20,(Node<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>
                       **)(in_RDI + 8));
  if (local_20[0] !=
      (Node<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>
       *)0x0) {
    ~Node((Node<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>
           *)0x1d34230);
    operator_delete(local_20[0]);
  }
  pVar1.second = local_8;
  pVar1.first = local_10;
  return pVar1;
}

Assistant:

T Release(Node *pNode) {
			T result = pNode->value();
			std::swap(pNode, cache);
			delete pNode;
			return result;
		}